

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,double,double>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
               *src,assign_op<double,_double> *param_3)

{
  long rows;
  long cols;
  long lVar1;
  long lVar2;
  
  rows = (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_rows;
  cols = (src->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       rows) ||
     (lVar1 = cols, lVar2 = rows,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,rows,cols);
    lVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((lVar2 == rows) && (lVar1 == cols)) {
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}